

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::detail::clone_if_necessary
          (detail *this,Boxed_Value *incoming,atomic_uint_fast32_t *t_loc,Dispatch_State *t_ss)

{
  bool bVar1;
  Type_Info *pTVar2;
  bool *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  Dispatch_Engine *pDVar3;
  int __flags;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Boxed_Value BVar5;
  string_view t_name;
  Function_Params local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [8];
  array<chaiscript::Boxed_Value,_1UL> params;
  Dispatch_State *t_ss_local;
  atomic_uint_fast32_t *t_loc_local;
  Boxed_Value *incoming_local;
  
  params._M_elems[0].m_data.
  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_ss;
  bVar1 = Boxed_Value::is_return_value(incoming);
  if (bVar1) {
    Boxed_Value::reset_return_value(incoming);
    Boxed_Value::Boxed_Value((Boxed_Value *)this,incoming);
    _Var4._M_pi = extraout_RDX_03;
  }
  else {
    pTVar2 = Boxed_Value::get_type_info(incoming);
    bVar1 = Type_Info::is_arithmetic(pTVar2);
    if (bVar1) {
      Boxed_Number::clone((__fn *)this,incoming,__flags,t_ss);
      _Var4._M_pi = extraout_RDX;
    }
    else {
      pTVar2 = Boxed_Value::get_type_info(incoming);
      bVar1 = Type_Info::bare_equal_type_info(pTVar2,(type_info *)&bool::typeinfo);
      if (bVar1) {
        t = (bool *)Boxed_Value::get_const_ptr(incoming);
        Boxed_Value::Boxed_Value<bool_const&,void>((Boxed_Value *)this,t,false);
        _Var4._M_pi = extraout_RDX_00;
      }
      else {
        pTVar2 = Boxed_Value::get_type_info(incoming);
        bVar1 = Type_Info::bare_equal_type_info(pTVar2,(type_info *)&std::__cxx11::string::typeinfo)
        ;
        if (bVar1) {
          t_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Boxed_Value::get_const_ptr(incoming);
          Boxed_Value::Boxed_Value<std::__cxx11::string_const&,void>((Boxed_Value *)this,t_00,false)
          ;
          _Var4._M_pi = extraout_RDX_01;
        }
        else {
          Boxed_Value::Boxed_Value((Boxed_Value *)local_38,incoming);
          pDVar3 = chaiscript::detail::Dispatch_State::operator->
                             ((Dispatch_State *)
                              params._M_elems[0].m_data.
                              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_48,"clone");
          Function_Params::Function_Params<1ul>
                    (&local_58,(array<chaiscript::Boxed_Value,_1UL> *)local_38);
          chaiscript::detail::Dispatch_State::conversions
                    ((Dispatch_State *)
                     params._M_elems[0].m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          t_name._M_str = (char *)local_48._M_len;
          t_name._M_len = (size_t)pDVar3;
          chaiscript::detail::Dispatch_Engine::call_function
                    ((Dispatch_Engine *)this,t_name,(atomic_uint_fast32_t *)local_48._M_str,
                     (Function_Params *)t_loc,(Type_Conversions_State *)&local_58);
          std::array<chaiscript::Boxed_Value,_1UL>::~array
                    ((array<chaiscript::Boxed_Value,_1UL> *)local_38);
          _Var4._M_pi = extraout_RDX_02;
        }
      }
    }
  }
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Boxed_Value clone_if_necessary(Boxed_Value incoming, std::atomic_uint_fast32_t &t_loc, const chaiscript::detail::Dispatch_State &t_ss) {
        if (!incoming.is_return_value()) {
          if (incoming.get_type_info().is_arithmetic()) {
            return Boxed_Number::clone(incoming);
          } else if (incoming.get_type_info().bare_equal_type_info(typeid(bool))) {
            return Boxed_Value(*static_cast<const bool *>(incoming.get_const_ptr()));
          } else if (incoming.get_type_info().bare_equal_type_info(typeid(std::string))) {
            return Boxed_Value(*static_cast<const std::string *>(incoming.get_const_ptr()));
          } else {
            std::array<Boxed_Value, 1> params{std::move(incoming)};
            return t_ss->call_function("clone", t_loc, Function_Params{params}, t_ss.conversions());
          }
        } else {
          incoming.reset_return_value();
          return incoming;
        }
      }